

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int multiSelectValues(Parse *pParse,Select *p,SelectDest *pDest)

{
  uint uVar1;
  char *pcVar2;
  int bShowAll;
  int rc;
  int nRow;
  SelectDest *pDest_local;
  Select *p_local;
  Parse *pParse_local;
  
  bShowAll = 1;
  uVar1 = (uint)(p->pLimit == (Expr *)0x0);
  for (pDest_local = (SelectDest *)p; pDest_local[2].zAffSdst != (char *)0x0;
      pDest_local = (SelectDest *)pDest_local[2].zAffSdst) {
    bShowAll = uVar1 + bShowAll;
  }
  pcVar2 = "S";
  if (bShowAll == 1) {
    pcVar2 = "";
  }
  sqlite3VdbeExplain(pParse,'\0',"SCAN %d CONSTANT ROW%s",(ulong)(uint)bShowAll,pcVar2);
  while ((pDest_local != (SelectDest *)0x0 &&
         (selectInnerLoop(pParse,(Select *)pDest_local,-1,(SortCtx *)0x0,(DistinctCtx *)0x0,pDest,1,
                          1), uVar1 != 0))) {
    *(short *)((long)&pDest_local->iSdst + 2) = (short)bShowAll;
    pDest_local = (SelectDest *)pDest_local[2].pOrderBy;
  }
  return 0;
}

Assistant:

static int multiSelectValues(
  Parse *pParse,        /* Parsing context */
  Select *p,            /* The right-most of SELECTs to be coded */
  SelectDest *pDest     /* What to do with query results */
){
  int nRow = 1;
  int rc = 0;
  int bShowAll = p->pLimit==0;
  assert( p->selFlags & SF_MultiValue );
  do{
    assert( p->selFlags & SF_Values );
    assert( p->op==TK_ALL || (p->op==TK_SELECT && p->pPrior==0) );
    assert( p->pNext==0 || p->pEList->nExpr==p->pNext->pEList->nExpr );
    if( p->pPrior==0 ) break;
    assert( p->pPrior->pNext==p );
    p = p->pPrior;
    nRow += bShowAll;
  }while(1);
  ExplainQueryPlan((pParse, 0, "SCAN %d CONSTANT ROW%s", nRow,
                    nRow==1 ? "" : "S"));
  while( p ){
    selectInnerLoop(pParse, p, -1, 0, 0, pDest, 1, 1);
    if( !bShowAll ) break;
    p->nSelectRow = nRow;
    p = p->pNext;
  }
  return rc;
}